

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_and(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *pBVar1;
  long in_RSI;
  long in_RDI;
  BtorSimBitVector *res;
  uint32_t i;
  undefined8 in_stack_ffffffffffffffe0;
  uint local_14;
  
  pBVar1 = btorsim_bv_new((uint32_t)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  for (local_14 = 0; local_14 < *(uint *)(in_RDI + 4); local_14 = local_14 + 1) {
    (&pBVar1[1].width)[local_14] =
         *(uint *)(in_RDI + 8 + (ulong)local_14 * 4) & *(uint *)(in_RSI + 8 + (ulong)local_14 * 4);
  }
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_and (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i;
  BtorSimBitVector *res;

  res = btorsim_bv_new (a->width);
  for (i = 0; i < a->len; i++) res->bits[i] = a->bits[i] & b->bits[i];

  assert (rem_bits_zero_dbg (res));
  return res;
}